

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

void __thiscall libDAI::TFactor<double>::TFactor(TFactor<double> *this,VarSet *ns,Real *p)

{
  size_t in_RDX;
  TProb<double> *in_RSI;
  VarSet *in_RDI;
  VarSet *in_stack_ffffffffffffffb8;
  Real *in_stack_ffffffffffffffe0;
  
  VarSet::VarSet(in_RDI,in_stack_ffffffffffffffb8);
  VarSet::stateSpace(in_RDI);
  TProb<double>::TProb(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  return;
}

Assistant:

TFactor( const VarSet& ns, const Real* p ) : _vs(ns), _p(_vs.stateSpace(),p) {}